

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

ptls_hash_context_t * ptls_hmac_create(ptls_hash_algorithm_t *algo,void *key,size_t key_size)

{
  st_picotls_hmac_context_t *__dest;
  ptls_hash_context_t *ppVar1;
  code *local_58;
  code *local_50;
  void *local_48;
  undefined8 local_40;
  undefined1 auStack_38 [8];
  st_picotls_hmac_context_t *local_30;
  st_picotls_hmac_context_t *ctx;
  size_t key_size_local;
  void *key_local;
  ptls_hash_algorithm_t *algo_local;
  
  ctx = (st_picotls_hmac_context_t *)key_size;
  key_size_local = (size_t)key;
  key_local = algo;
  __dest = (st_picotls_hmac_context_t *)malloc(algo->block_size + 0x20);
  if (__dest == (st_picotls_hmac_context_t *)0x0) {
    algo_local = (ptls_hash_algorithm_t *)0x0;
  }
  else {
    local_58 = hmac_update;
    local_50 = hmac_final;
    local_48 = key_local;
    local_40 = 0;
    local_30 = __dest;
    memset(auStack_38,0,1);
    memcpy(__dest,&local_58,0x28);
    ppVar1 = (ptls_hash_context_t *)(**(code **)((long)key_local + 0x10))();
    local_30->hash = ppVar1;
    if (ppVar1 == (ptls_hash_context_t *)0x0) {
      free(local_30);
      algo_local = (ptls_hash_algorithm_t *)0x0;
    }
    else {
      memset(local_30->key,0,*key_local);
      memcpy(local_30->key,(void *)key_size_local,(size_t)ctx);
      hmac_apply_key(local_30,'6');
      algo_local = (ptls_hash_algorithm_t *)local_30;
    }
  }
  return (ptls_hash_context_t *)algo_local;
}

Assistant:

ptls_hash_context_t *ptls_hmac_create(ptls_hash_algorithm_t *algo, const void *key, size_t key_size)
{
    struct st_picotls_hmac_context_t *ctx;

    if ((ctx = malloc(offsetof(struct st_picotls_hmac_context_t, key) + algo->block_size)) == NULL)
        return NULL;

    *ctx = (struct st_picotls_hmac_context_t){{hmac_update, hmac_final}, algo};
    if ((ctx->hash = algo->create()) == NULL) {
        free(ctx);
        return NULL;
    }
    memset(ctx->key, 0, algo->block_size);
    memcpy(ctx->key, key, key_size);

    hmac_apply_key(ctx, 0x36);

    return &ctx->super;
}